

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

int udp_ep_init(udp_ep *ep,nng_url *url,nni_sock *sock,nni_dialer *d,nni_listener *l)

{
  nni_mtx *mtx;
  nni_stat_item *item;
  nni_stat_item *item_00;
  nni_stat_item *item_01;
  nni_stat_item *item_02;
  nni_stat_item *item_03;
  nni_stat_item *item_04;
  nni_stat_item *item_05;
  nni_stat_item *item_06;
  nni_stat_item *item_07;
  nni_stat_item *item_08;
  char *__s1;
  uint16_t uVar1;
  int iVar2;
  udp_txdesc *puVar3;
  
  mtx = &ep->mtx;
  nni_mtx_init(mtx);
  nni_id_map_init(&ep->pipes,1,0xffffffff,true);
  nni_list_init_offset(&ep->connpipes,0xd0);
  nni_aio_list_init(&ep->connaios);
  nni_aio_init(&ep->rx_aio,udp_rx_cb,ep);
  nni_aio_init(&ep->tx_aio,udp_tx_cb,ep);
  nni_aio_init(&ep->timeaio,udp_timer_cb,ep);
  nni_aio_init(&ep->resaio,udp_resolv_cb,ep);
  nni_aio_completions_init(&ep->complq);
  puVar3 = (udp_txdesc *)nni_zalloc(0x1600);
  (ep->tx_ring).descs = puVar3;
  if (puVar3 == (udp_txdesc *)0x0) {
    nni_free(ep,0xd38);
    return 2;
  }
  (ep->tx_ring).size = 0x20;
  __s1 = url->u_scheme;
  iVar2 = strcmp(__s1,"udp");
  if (iVar2 == 0) {
    uVar1 = 0;
  }
  else {
    iVar2 = strcmp(__s1,"udp4");
    if (iVar2 == 0) {
      uVar1 = 3;
    }
    else {
      iVar2 = strcmp(__s1,"udp6");
      if (iVar2 != 0) {
        return 0xf;
      }
      uVar1 = 4;
    }
  }
  ep->af = uVar1;
  (ep->self_sa).s_family = uVar1;
  uVar1 = nni_sock_proto_id(sock);
  ep->proto = uVar1;
  ep->url = url;
  ep->refresh = 5000;
  ep->rcvmax = 65000;
  ep->copymax = 0x400;
  iVar2 = nni_msg_alloc(&ep->rx_payload,65000);
  if (iVar2 != 0) {
    nni_free((ep->tx_ring).descs,0x1600);
    return 1;
  }
  item = &ep->st_rcv_max;
  nni_stat_init_lock(item,&udp_ep_init::rcv_max_info,mtx);
  item_00 = &ep->st_copy_max;
  nni_stat_init_lock(item_00,&udp_ep_init::copy_max_info,mtx);
  item_01 = &ep->st_rcv_copy;
  nni_stat_init_lock(item_01,&udp_ep_init::rcv_copy_info,mtx);
  item_02 = &ep->st_rcv_nocopy;
  nni_stat_init_lock(item_02,&udp_ep_init::rcv_nocopy_info,mtx);
  item_03 = &ep->st_rcv_reorder;
  nni_stat_init_lock(item_03,&udp_ep_init::rcv_reorder_info,mtx);
  item_04 = &ep->st_rcv_toobig;
  nni_stat_init_lock(item_04,&udp_ep_init::rcv_toobig_info,mtx);
  item_05 = &ep->st_rcv_nomatch;
  nni_stat_init_lock(item_05,&udp_ep_init::rcv_nomatch_info,mtx);
  item_06 = &ep->st_rcv_nobuf;
  nni_stat_init_lock(item_06,&udp_ep_init::rcv_nobuf_info,mtx);
  item_07 = &ep->st_snd_toobig;
  nni_stat_init_lock(item_07,&udp_ep_init::snd_toobig_info,mtx);
  item_08 = &ep->st_snd_nobuf;
  nni_stat_init_lock(item_08,&udp_ep_init::snd_nobuf_info,mtx);
  nni_stat_init_lock(&ep->st_peer_inactive,&udp_ep_init::peer_inactive_info,mtx);
  if (l == (nni_listener *)0x0) {
    if (d == (nni_dialer *)0x0) goto LAB_0012c794;
  }
  else {
    if (d == (nni_dialer *)0x0) {
      nni_listener_add_stat(l,item);
      nni_listener_add_stat(l,item_00);
      nni_listener_add_stat(l,item_01);
      nni_listener_add_stat(l,item_02);
      nni_listener_add_stat(l,item_03);
      nni_listener_add_stat(l,item_04);
      nni_listener_add_stat(l,item_05);
      nni_listener_add_stat(l,item_06);
      nni_listener_add_stat(l,item_07);
      nni_listener_add_stat(l,item_08);
      goto LAB_0012c794;
    }
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp.c"
              ,0x53c,"d == NULL");
    nni_listener_add_stat(l,item);
    nni_listener_add_stat(l,item_00);
    nni_listener_add_stat(l,item_01);
    nni_listener_add_stat(l,item_02);
    nni_listener_add_stat(l,item_03);
    nni_listener_add_stat(l,item_04);
    nni_listener_add_stat(l,item_05);
    nni_listener_add_stat(l,item_06);
    nni_listener_add_stat(l,item_07);
    nni_listener_add_stat(l,item_08);
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp.c"
              ,0x549,"l == NULL");
  }
  nni_dialer_add_stat(d,item);
  nni_dialer_add_stat(d,item_00);
  nni_dialer_add_stat(d,item_01);
  nni_dialer_add_stat(d,item_02);
  nni_dialer_add_stat(d,item_03);
  nni_dialer_add_stat(d,item_04);
  nni_dialer_add_stat(d,item_05);
  nni_dialer_add_stat(d,item_06);
  nni_dialer_add_stat(d,item_07);
  nni_dialer_add_stat(d,item_08);
LAB_0012c794:
  nni_sleep_aio(-1,&ep->timeaio);
  return 0;
}

Assistant:

static int
udp_ep_init(
    udp_ep *ep, nng_url *url, nni_sock *sock, nni_dialer *d, nni_listener *l)
{
	int rv;

	nni_mtx_init(&ep->mtx);
	nni_id_map_init(&ep->pipes, 1, 0xFFFFFFFF, true);
	NNI_LIST_INIT(&ep->connpipes, udp_pipe, node);
	nni_aio_list_init(&ep->connaios);

	nni_aio_init(&ep->rx_aio, udp_rx_cb, ep);
	nni_aio_init(&ep->tx_aio, udp_tx_cb, ep);
	nni_aio_init(&ep->timeaio, udp_timer_cb, ep);
	nni_aio_init(&ep->resaio, udp_resolv_cb, ep);
	nni_aio_completions_init(&ep->complq);

	ep->tx_ring.descs =
	    NNI_ALLOC_STRUCTS(ep->tx_ring.descs, NNG_UDP_TXQUEUE_LEN);
	if (ep->tx_ring.descs == NULL) {
		NNI_FREE_STRUCT(ep);
		return (NNG_ENOMEM);
	}
	ep->tx_ring.size = NNG_UDP_TXQUEUE_LEN;

	if (strcmp(url->u_scheme, "udp") == 0) {
		ep->af = NNG_AF_UNSPEC;
	} else if (strcmp(url->u_scheme, "udp4") == 0) {
		ep->af = NNG_AF_INET;
	} else if (strcmp(url->u_scheme, "udp6") == 0) {
		ep->af = NNG_AF_INET6;
	} else {
		return (NNG_EADDRINVAL);
	}

	ep->self_sa.s_family = ep->af;
	ep->proto            = nni_sock_proto_id(sock);
	ep->url              = url;
	ep->refresh          = NNG_UDP_REFRESH; // one minute by default
	ep->rcvmax           = NNG_UDP_RECVMAX;
	ep->copymax          = NNG_UDP_COPYMAX;
	if ((rv = nni_msg_alloc(&ep->rx_payload, ep->rcvmax) != 0)) {
		NNI_FREE_STRUCTS(ep->tx_ring.descs, NNG_UDP_TXQUEUE_LEN);
		return (rv);
	}

	NNI_STAT_LOCK(rcv_max_info, "rcv_max", "maximum receive size",
	    NNG_STAT_LEVEL, NNG_UNIT_BYTES);
	NNI_STAT_LOCK(copy_max_info, "copy_max",
	    "threshold to switch to loan-up", NNG_STAT_LEVEL, NNG_UNIT_BYTES);
	NNI_STAT_LOCK(rcv_reorder_info, "rcv_reorder",
	    "messages received out of order", NNG_STAT_COUNTER,
	    NNG_UNIT_MESSAGES);
	NNI_STAT_LOCK(rcv_nomatch_info, "rcv_nomatch",
	    "messages without a matching connection", NNG_STAT_COUNTER,
	    NNG_UNIT_MESSAGES);
	NNI_STAT_LOCK(rcv_toobig_info, "rcv_toobig",
	    "received messages rejected because too big", NNG_STAT_COUNTER,
	    NNG_UNIT_MESSAGES);
	NNI_STAT_LOCK(rcv_copy_info, "rcv_copy",
	    "received messages copied (small)", NNG_STAT_COUNTER,
	    NNG_UNIT_MESSAGES);
	NNI_STAT_LOCK(rcv_nocopy_info, "rcv_nocopy",
	    "received messages zero copy (large)", NNG_STAT_COUNTER,
	    NNG_UNIT_MESSAGES);
	NNI_STAT_LOCK(rcv_nobuf_info, "rcv_nobuf",
	    "received messages dropped no buffer", NNG_STAT_COUNTER,
	    NNG_UNIT_MESSAGES);
	NNI_STAT_LOCK(snd_toobig_info, "snd_toobig",
	    "sent messages rejected because too big", NNG_STAT_COUNTER,
	    NNG_UNIT_MESSAGES);
	NNI_STAT_LOCK(snd_nobuf_info, "snd_nobuf",
	    "sent messages dropped no buffer", NNG_STAT_COUNTER,
	    NNG_UNIT_MESSAGES);
	NNI_STAT_LOCK(peer_inactive_info, "peer_inactive",
	    "connections closed due to inactive peer", NNG_STAT_COUNTER,
	    NNG_UNIT_EVENTS);

	nni_stat_init_lock(&ep->st_rcv_max, &rcv_max_info, &ep->mtx);
	nni_stat_init_lock(&ep->st_copy_max, &copy_max_info, &ep->mtx);
	nni_stat_init_lock(&ep->st_rcv_copy, &rcv_copy_info, &ep->mtx);
	nni_stat_init_lock(&ep->st_rcv_nocopy, &rcv_nocopy_info, &ep->mtx);
	nni_stat_init_lock(&ep->st_rcv_reorder, &rcv_reorder_info, &ep->mtx);
	nni_stat_init_lock(&ep->st_rcv_toobig, &rcv_toobig_info, &ep->mtx);
	nni_stat_init_lock(&ep->st_rcv_nomatch, &rcv_nomatch_info, &ep->mtx);
	nni_stat_init_lock(&ep->st_rcv_nobuf, &rcv_nobuf_info, &ep->mtx);
	nni_stat_init_lock(&ep->st_snd_toobig, &snd_toobig_info, &ep->mtx);
	nni_stat_init_lock(&ep->st_snd_nobuf, &snd_nobuf_info, &ep->mtx);
	nni_stat_init_lock(
	    &ep->st_peer_inactive, &peer_inactive_info, &ep->mtx);

	if (l) {
		NNI_ASSERT(d == NULL);
		nni_listener_add_stat(l, &ep->st_rcv_max);
		nni_listener_add_stat(l, &ep->st_copy_max);
		nni_listener_add_stat(l, &ep->st_rcv_copy);
		nni_listener_add_stat(l, &ep->st_rcv_nocopy);
		nni_listener_add_stat(l, &ep->st_rcv_reorder);
		nni_listener_add_stat(l, &ep->st_rcv_toobig);
		nni_listener_add_stat(l, &ep->st_rcv_nomatch);
		nni_listener_add_stat(l, &ep->st_rcv_nobuf);
		nni_listener_add_stat(l, &ep->st_snd_toobig);
		nni_listener_add_stat(l, &ep->st_snd_nobuf);
	}
	if (d) {
		NNI_ASSERT(l == NULL);
		nni_dialer_add_stat(d, &ep->st_rcv_max);
		nni_dialer_add_stat(d, &ep->st_copy_max);
		nni_dialer_add_stat(d, &ep->st_rcv_copy);
		nni_dialer_add_stat(d, &ep->st_rcv_nocopy);
		nni_dialer_add_stat(d, &ep->st_rcv_reorder);
		nni_dialer_add_stat(d, &ep->st_rcv_toobig);
		nni_dialer_add_stat(d, &ep->st_rcv_nomatch);
		nni_dialer_add_stat(d, &ep->st_rcv_nobuf);
		nni_dialer_add_stat(d, &ep->st_snd_toobig);
		nni_dialer_add_stat(d, &ep->st_snd_nobuf);
	}

	// schedule our timer callback - forever for now
	// adjusted automatically as we add pipes or other
	// actions which require earlier wakeup.
	nni_sleep_aio(NNG_DURATION_INFINITE, &ep->timeaio);

	return (0);
}